

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

xmlHashEntry *
xmlHashFindEntry(xmlHashTable *hash,xmlChar *key,xmlChar *key2,xmlChar *key3,uint hashValue,
                int *pfound)

{
  xmlHashEntry *pxVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  xmlHashEntry *pxVar6;
  uint uVar7;
  
  uVar7 = hash->size - 1;
  uVar4 = uVar7 & hashValue;
  pxVar1 = hash->table;
  pxVar6 = pxVar1 + uVar4;
  uVar2 = pxVar1[uVar4].hashValue;
  if (uVar2 == 0) {
    iVar3 = 0;
  }
  else {
    uVar5 = 0;
    while ((uVar4 = uVar4 + 1, uVar2 != (hashValue | 0x80000000) ||
           (((((hash->dict == (xmlDictPtr)0x0 || (pxVar6->key != key)) || (pxVar6->key2 != key2)) ||
             (pxVar6->key3 != key3)) &&
            (((iVar3 = strcmp((char *)pxVar6->key,(char *)key), iVar3 != 0 ||
              (iVar3 = xmlFastStrEqual(pxVar6->key2,key2), iVar3 == 0)) ||
             (iVar3 = xmlFastStrEqual(pxVar6->key3,key3), iVar3 == 0))))))) {
      pxVar6 = pxVar6 + 1;
      if ((uVar4 & uVar7) == 0) {
        pxVar6 = pxVar1;
      }
      uVar2 = pxVar6->hashValue;
      iVar3 = 0;
      if ((uVar2 == 0) || (uVar5 = uVar5 + 1, (uVar4 - uVar2 & uVar7) < uVar5)) goto LAB_0012e656;
    }
    iVar3 = 1;
  }
LAB_0012e656:
  *pfound = iVar3;
  return pxVar6;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static xmlHashEntry *
xmlHashFindEntry(const xmlHashTable *hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 unsigned hashValue, int *pfound) {
    xmlHashEntry *entry;
    unsigned mask, pos, displ;
    int found = 0;

    mask = hash->size - 1;
    pos = hashValue & mask;
    entry = &hash->table[pos];

    if (entry->hashValue != 0) {
        /*
         * Robin hood hashing: abort if the displacement of the entry
         * is smaller than the displacement of the key we look for.
         * This also stops at the correct position when inserting.
         */
        displ = 0;
        hashValue |= MAX_HASH_SIZE;

        do {
            if (entry->hashValue == hashValue) {
                if (hash->dict) {
                    if ((entry->key == key) &&
                        (entry->key2 == key2) &&
                        (entry->key3 == key3)) {
                        found = 1;
                        break;
                    }
                }
                if ((strcmp((const char *) entry->key,
                            (const char *) key) == 0) &&
                    (xmlFastStrEqual(entry->key2, key2)) &&
                    (xmlFastStrEqual(entry->key3, key3))) {
                    found = 1;
                    break;
                }
            }

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = hash->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    *pfound = found;
    return(entry);
}